

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

void __thiscall
ICM::Compiler::PreliminaryCompile::setDoNode(PreliminaryCompile *this,Node *node,VecElt *dolist)

{
  vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
  *this_00;
  size_type id_00;
  Node *this_01;
  Element EVar1;
  anon_union_4_2_4727c1b0_for_Element_0 local_58 [2];
  Element e;
  Node *p;
  size_t id;
  VecElt *dolist_local;
  Node *node_local;
  PreliminaryCompile *this_local;
  
  id_00 = std::
          vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
          ::size((this->super_AnalysisBase).Table);
  this_01 = (Node *)operator_new(0x20);
  ASTBase::Node::Node(this_01,id_00,dolist);
  this_00 = (this->super_AnalysisBase).Table;
  std::unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>>::
  unique_ptr<std::default_delete<ICM::ASTBase::Node>,void>
            ((unique_ptr<ICM::ASTBase::Node,std::default_delete<ICM::ASTBase::Node>> *)&e.index,
             this_01);
  std::
  vector<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>,_std::allocator<std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>_>_>
  ::push_back(this_00,(value_type *)&e.index);
  std::unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_>::~unique_ptr
            ((unique_ptr<ICM::ASTBase::Node,_std::default_delete<ICM::ASTBase::Node>_> *)&e.index);
  EVar1 = ASTBase::Element::Refer(id_00);
  e._0_8_ = EVar1.index;
  local_58[0] = EVar1.field_0;
  std::vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>::push_back
            (&node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>,
             (value_type *)&local_58[0].field_0);
  adjustNode(this,this_01,1);
  return;
}

Assistant:

void setDoNode(Node &node, VecElt &dolist) {
				size_t id = Table.size();
				Node *p = new Node(id, std::move(dolist));
				Table.push_back(std::move(std::unique_ptr<Node>(p)));
				Element e = Element::Refer(id);
				node.push_back(e);
				adjustNode(*p, 1);
			}